

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
re2::Explode_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,re2 *this,StringPiece *s)

{
  char *pcVar1;
  iterator pcVar2;
  int iVar3;
  iterator pcVar4;
  ulong uVar5;
  allocator local_69;
  string local_68 [36];
  Rune local_44;
  char *pcStack_40;
  Rune r;
  char *p;
  iterator local_28;
  char *q;
  StringPiece *local_18;
  StringPiece *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  
  q._7_1_ = 0;
  local_18 = (StringPiece *)this;
  s_local = (StringPiece *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = StringPiece::begin(local_18);
  while (pcVar2 = local_28, pcVar4 = StringPiece::end(local_18), pcVar2 < pcVar4) {
    pcStack_40 = local_28;
    iVar3 = chartorune(&local_44,local_28);
    pcVar1 = pcStack_40;
    local_28 = local_28 + iVar3;
    uVar5 = (long)local_28 - (long)pcStack_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,uVar5,&local_69);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> Explode(const StringPiece& s) {
  vector<string> v;

  for (const char *q = s.begin(); q < s.end(); ) {
    const char* p = q;
    Rune r;
    q += chartorune(&r, q);
    v.push_back(string(p, q - p));
  }

  return v;
}